

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avs2d_ps.c
# Opt level: O0

MPP_RET parse_one_rps(BitReadCtx_t *bitctx,Avs2dRps_t *rps)

{
  MPP_RET MVar1;
  char local_44 [7];
  char local_3d;
  RK_S32 _out_5;
  RK_U8 aRStack_38 [3];
  RK_U8 bval;
  RK_S32 _out_4;
  RK_S32 _out_3;
  RK_S32 _out_2;
  RK_S32 _out_1;
  RK_S32 _out;
  RK_U32 j;
  MPP_RET ret;
  Avs2dRps_t *rps_local;
  BitReadCtx_t *bitctx_local;
  
  _out = 0;
  _j = rps;
  rps_local = (Avs2dRps_t *)bitctx;
  if ((avs2d_parse_debug & 8) != 0) {
    _mpp_log_l(4,"avs2d_ps","In","parse_one_rps");
  }
  MVar1 = mpp_read_bits((BitReadCtx_t *)rps_local,1,&_out_2);
  rps_local[2].reserved = MVar1;
  if (rps_local[2].reserved == 0) {
    _j->refered_by_others = (RK_U8)_out_2;
    MVar1 = mpp_read_bits((BitReadCtx_t *)rps_local,3,&_out_3);
    rps_local[2].reserved = MVar1;
    if (rps_local[2].reserved == 0) {
      _j->num_of_ref = (RK_U8)_out_3;
      if ((avs2d_parse_debug & 8) != 0) {
        _mpp_log_l(4,"avs2d_ps","refered_by_others_flag %d, num_Of_ref %d","parse_one_rps",
                   (ulong)_j->refered_by_others,(ulong)_j->num_of_ref);
      }
      if (7 < _j->num_of_ref) {
        _out = -1;
        _mpp_log_l(2,"avs2d_ps","invalid ref num(%d).\n","parse_one_rps",(ulong)_j->num_of_ref);
        if ((avs2d_parse_debug & 8) != 0) {
          _mpp_log_l(4,"avs2d_ps","Out Failed\n","parse_one_rps");
        }
        return _out;
      }
      for (_out_1 = 0; (uint)_out_1 < (uint)_j->num_of_ref; _out_1 = _out_1 + 1) {
        MVar1 = mpp_read_bits((BitReadCtx_t *)rps_local,6,&_out_4);
        rps_local[2].reserved = MVar1;
        if (rps_local[2].reserved != 0) goto LAB_001ae4ed;
        _j->ref_pic[(uint)_out_1] = (RK_U8)_out_4;
        if ((avs2d_parse_debug & 8) != 0) {
          _mpp_log_l(4,"avs2d_ps","delta_doi_of_ref_pic[%d]=%d","parse_one_rps",(ulong)(uint)_out_1,
                     (ulong)_j->ref_pic[(uint)_out_1]);
        }
      }
      MVar1 = mpp_read_bits((BitReadCtx_t *)rps_local,3,(RK_S32 *)aRStack_38);
      rps_local[2].reserved = MVar1;
      if (rps_local[2].reserved == 0) {
        _j->num_to_remove = aRStack_38[0];
        for (_out_1 = 0; (uint)_out_1 < (uint)_j->num_to_remove; _out_1 = _out_1 + 1) {
          MVar1 = mpp_read_bits((BitReadCtx_t *)rps_local,6,&_out_5);
          rps_local[2].reserved = MVar1;
          if (rps_local[2].reserved != 0) goto LAB_001ae4ed;
          _j->remove_pic[(uint)_out_1] = (RK_U8)_out_5;
          if ((avs2d_parse_debug & 8) != 0) {
            _mpp_log_l(4,"avs2d_ps","num_of_removed_pic[%d]=%d","parse_one_rps",(ulong)(uint)_out_1,
                       (ulong)_j->remove_pic[(uint)_out_1]);
          }
        }
        MVar1 = mpp_read_bits((BitReadCtx_t *)rps_local,1,(RK_S32 *)local_44);
        rps_local[2].reserved = MVar1;
        if (rps_local[2].reserved == 0) {
          local_3d = local_44[0];
          if ((local_44[0] != '\x01') && ((avs2d_parse_debug & 4) != 0)) {
            _mpp_log_l(4,"avs2d_ps","expected marker_bit 1 while received 0(%d).\n",(char *)0x0,
                       0x10c);
          }
          if ((avs2d_parse_debug & 8) != 0) {
            _mpp_log_l(4,"avs2d_ps","Out ret %d\n","parse_one_rps",(ulong)(uint)_out);
          }
          return _out;
        }
      }
    }
  }
LAB_001ae4ed:
  if ((avs2d_parse_debug & 8) != 0) {
    _mpp_log_l(4,"avs2d_ps","Out Bit read Err\n","parse_one_rps");
  }
  return rps_local[2].reserved;
}

Assistant:

static MPP_RET parse_one_rps(BitReadCtx_t *bitctx, Avs2dRps_t *rps)
{
    MPP_RET ret = MPP_OK;
    RK_U32 j;

    AVS2D_PARSE_TRACE("In");
    READ_ONEBIT(bitctx, &rps->refered_by_others);

    READ_BITS(bitctx, 3, &rps->num_of_ref);
    AVS2D_PARSE_TRACE("refered_by_others_flag %d, num_Of_ref %d", rps->refered_by_others, rps->num_of_ref);
    if (rps->num_of_ref > AVS2_MAX_REFS) {
        ret = MPP_NOK;
        mpp_err_f("invalid ref num(%d).\n", rps->num_of_ref);
        goto __FAILED;
    }
    for (j = 0; j < rps->num_of_ref; j++) {
        READ_BITS(bitctx, 6, &rps->ref_pic[j]);
        AVS2D_PARSE_TRACE("delta_doi_of_ref_pic[%d]=%d", j, rps->ref_pic[j]);
    }

    READ_BITS(bitctx, 3, &rps->num_to_remove);
    for (j = 0; j < rps->num_to_remove; j++) {
        READ_BITS(bitctx, 6, &rps->remove_pic[j]);
        AVS2D_PARSE_TRACE("num_of_removed_pic[%d]=%d", j, rps->remove_pic[j]);
    }

    READ_MARKER_BIT(bitctx);
    AVS2D_PARSE_TRACE("Out ret %d\n", ret);
    return ret;
__BITREAD_ERR:
    AVS2D_PARSE_TRACE("Out Bit read Err\n");
    return ret = bitctx->ret;
__FAILED:
    AVS2D_PARSE_TRACE("Out Failed\n");
    return ret;
}